

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void deferred_on_data(void *uuid,void *arg2)

{
  char *pcVar1;
  char cVar2;
  fio_defer_task_s task;
  int iVar3;
  fio_protocol_s *pfVar4;
  int *piVar5;
  long fd;
  long lVar6;
  fio_lock_i ret;
  
  iVar3 = fio_is_closed((intptr_t)uuid);
  if (iVar3 == 0) {
    fd = (long)(int)((ulong)uuid >> 8);
    lVar6 = fd * 0xa8;
    if (*(long *)((long)fio_data + lVar6 + 0x58) == 0) {
      deferred_on_ready(uuid,arg2);
      return;
    }
    pfVar4 = protocol_try_lock(fd,FIO_PR_LOCK_TASK);
    if (pfVar4 == (fio_protocol_s *)0x0) {
      piVar5 = __errno_location();
      if (*piVar5 != 9) {
        if (arg2 == (void *)0x0) goto LAB_001275cc;
        task.arg1 = uuid;
        task.func = deferred_on_data;
        task.arg2 = &DAT_00000001;
        fio_defer_push_task_fn(task,&task_queue_normal);
      }
    }
    else {
      LOCK();
      *(undefined1 *)((long)fio_data + lVar6 + 0x6b) = 0;
      UNLOCK();
      (*pfVar4->on_data)((intptr_t)uuid,pfVar4);
      LOCK();
      *(undefined1 *)&pfVar4->rsv = 0;
      UNLOCK();
      LOCK();
      pcVar1 = (char *)((long)fio_data + lVar6 + 0x6b);
      cVar2 = *pcVar1;
      *pcVar1 = '\x01';
      UNLOCK();
      if (cVar2 == '\0') {
LAB_001275cc:
        fio_poll_add_read(fd);
        return;
      }
    }
  }
  return;
}

Assistant:

static void deferred_on_data(void *uuid, void *arg2) {
  if (fio_is_closed((intptr_t)uuid)) {
    return;
  }
  if (!uuid_data(uuid).protocol)
    goto no_protocol;
  fio_protocol_s *pr = protocol_try_lock(fio_uuid2fd(uuid), FIO_PR_LOCK_TASK);
  if (!pr) {
    if (errno == EBADF) {
      return;
    }
    goto postpone;
  }
  fio_unlock(&uuid_data(uuid).scheduled);
  pr->on_data((intptr_t)uuid, pr);
  protocol_unlock(pr, FIO_PR_LOCK_TASK);
  if (!fio_trylock(&uuid_data(uuid).scheduled)) {
    fio_poll_add_read(fio_uuid2fd((intptr_t)uuid));
  }
  return;

postpone:
  if (arg2) {
    /* the event is being forced, so force rescheduling */
    fio_defer_push_task(deferred_on_data, (void *)uuid, (void *)1);
  } else {
    /* the protocol was locked, so there might not be any need for the event */
    fio_poll_add_read(fio_uuid2fd((intptr_t)uuid));
  }
  return;

no_protocol:
  /* a missing protocol might still want to invoke the RW hook flush */
  deferred_on_ready(uuid, arg2);
  return;
}